

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int nni_chunk_insert(nni_chunk *ch,void *data,size_t len)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_t shift;
  _Bool grow;
  int rv;
  size_t len_local;
  void *data_local;
  nni_chunk *ch_local;
  
  bVar1 = false;
  if (ch->ch_ptr == (uint8_t *)0x0) {
    ch->ch_ptr = ch->ch_buf;
  }
  if ((ch->ch_ptr < ch->ch_buf) || (ch->ch_buf + ch->ch_cap <= ch->ch_ptr)) {
    bVar1 = true;
  }
  else if ((ulong)((long)ch->ch_ptr - (long)ch->ch_buf) < len) {
    bVar1 = ch->ch_cap < ch->ch_len + len + 8;
    if (!bVar1) {
      uVar3 = (ch->ch_cap - (ch->ch_len + len) >> 1) + 7 & 0xfffffffffffffff8;
      memmove(ch->ch_buf + uVar3,ch->ch_ptr,ch->ch_len);
      ch->ch_ptr = ch->ch_buf + uVar3;
    }
  }
  else {
    ch->ch_ptr = ch->ch_ptr + -len;
  }
  if (bVar1) {
    iVar2 = nni_chunk_grow(ch,0,len);
    if (iVar2 != 0) {
      return iVar2;
    }
    ch->ch_ptr = ch->ch_ptr + -len;
  }
  ch->ch_len = len + ch->ch_len;
  if (data != (void *)0x0) {
    memcpy(ch->ch_ptr,data,len);
  }
  return 0;
}

Assistant:

static int
nni_chunk_insert(nni_chunk *ch, const void *data, size_t len)
{
	int  rv;
	bool grow = false;

	if (ch->ch_ptr == NULL) {
		ch->ch_ptr = ch->ch_buf;
	}

	if ((ch->ch_ptr >= ch->ch_buf) &&
	    (ch->ch_ptr < (ch->ch_buf + ch->ch_cap))) {

		if (len <= (size_t) (ch->ch_ptr - ch->ch_buf)) {
			// There is already enough room at the beginning.
			ch->ch_ptr -= len;
		} else if ((ch->ch_len + len + sizeof(uint64_t)) <=
		    ch->ch_cap) {
			// We have some room.  Split it between the head and
			// tail. This is an attempt to reduce the likelhood of
			// repeated shifts.  We round it up to preserve
			// alignment along pointers.  Note that this
			//
			// We've ensured we have an extra
			// pad for alignment in the check above.
			size_t shift = ((ch->ch_cap - (ch->ch_len + len)) / 2);
			shift        = (shift + (sizeof(uint64_t) - 1)) &
			    ~(sizeof(uint64_t) - 1);
			memmove(ch->ch_buf + shift, ch->ch_ptr, ch->ch_len);
			ch->ch_ptr = ch->ch_buf + shift;
		} else {
			grow = true;
		}
	} else {
		grow = true;
	}
	if (grow) {
		if ((rv = nni_chunk_grow(ch, 0, len)) == 0) {
			// We grew the chunk, so adjust.
			ch->ch_ptr -= len;
		} else {
			// Couldn't grow the chunk either.  Error.
			return (rv);
		}
	}

	ch->ch_len += len;
	if (data != NULL) {
		memcpy(ch->ch_ptr, data, len);
	}

	return (0);
}